

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O2

unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true> __thiscall
duckdb::PhysicalBlockwiseNLJoin::GetOperatorState
          (PhysicalBlockwiseNLJoin *this,ExecutionContext *context)

{
  pointer pLVar1;
  char cVar2;
  pointer pGVar3;
  const_reference pvVar4;
  pointer pBVar5;
  Allocator *allocator;
  NotImplementedException *this_00;
  ExecutionContext *in_RDX;
  LogicalType *type;
  pointer pLVar6;
  LogicalType *type_1;
  allocator local_61;
  _Head_base<0UL,_duckdb::BlockwiseNLJoinState_*,_false> local_60;
  vector<duckdb::LogicalType,_true> intermediate_types;
  
  pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                       *)(context + 3));
  make_uniq<duckdb::BlockwiseNLJoinState,duckdb::ExecutionContext&,duckdb::ColumnDataCollection&,duckdb::PhysicalBlockwiseNLJoin_const&>
            ((duckdb *)&local_60,in_RDX,
             (ColumnDataCollection *)
             &pGVar3[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
             ,(PhysicalBlockwiseNLJoin *)context);
  cVar2 = *(char *)((long)&context[5].thread + 1);
  if ((byte)(cVar2 - 5U) < 2) {
    intermediate_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    intermediate_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    intermediate_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                       ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                        &context->pipeline,0);
    pLVar1 = (pvVar4->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pLVar6 = (pvVar4->_M_data->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start; pLVar6 != pLVar1; pLVar6 = pLVar6 + 1) {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                 &intermediate_types,pLVar6);
    }
    pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                       ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                        &context->pipeline,1);
    pLVar1 = (pvVar4->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pLVar6 = (pvVar4->_M_data->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start; pLVar6 != pLVar1; pLVar6 = pLVar6 + 1) {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                 &intermediate_types,pLVar6);
    }
    pBVar5 = unique_ptr<duckdb::BlockwiseNLJoinState,_std::default_delete<duckdb::BlockwiseNLJoinState>,_true>
             ::operator->((unique_ptr<duckdb::BlockwiseNLJoinState,_std::default_delete<duckdb::BlockwiseNLJoinState>,_true>
                           *)&local_60);
    allocator = Allocator::DefaultAllocator();
    DataChunk::Initialize(&pBVar5->intermediate_chunk,allocator,&intermediate_types,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&intermediate_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    cVar2 = *(char *)((long)&context[5].thread + 1);
  }
  if (1 < (byte)(cVar2 - 9U)) {
    (this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
    _vptr_PhysicalOperator = (_func_int **)local_60._M_head_impl;
    return (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)
           (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)this;
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&intermediate_types,
             "physical blockwise RIGHT_SEMI/RIGHT_ANTI join not yet implemented",&local_61);
  NotImplementedException::NotImplementedException(this_00,(string *)&intermediate_types);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<OperatorState> PhysicalBlockwiseNLJoin::GetOperatorState(ExecutionContext &context) const {
	auto &gstate = sink_state->Cast<BlockwiseNLJoinGlobalState>();
	auto result = make_uniq<BlockwiseNLJoinState>(context, gstate.right_chunks, *this);
	if (join_type == JoinType::SEMI || join_type == JoinType::ANTI) {
		vector<LogicalType> intermediate_types;
		for (auto &type : children[0].get().GetTypes()) {
			intermediate_types.emplace_back(type);
		}
		for (auto &type : children[1].get().GetTypes()) {
			intermediate_types.emplace_back(type);
		}
		result->intermediate_chunk.Initialize(Allocator::DefaultAllocator(), intermediate_types);
	}
	if (join_type == JoinType::RIGHT_ANTI || join_type == JoinType::RIGHT_SEMI) {
		throw NotImplementedException("physical blockwise RIGHT_SEMI/RIGHT_ANTI join not yet implemented");
	}
	return std::move(result);
}